

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O1

UEnumeration *
ucurr_getKeywordValuesForLocale_63(char *key,char *locale,UBool commonlyUsed,UErrorCode *status)

{
  UErrorCode UVar1;
  UBool UVar2;
  int iVar3;
  UResType UVar4;
  int32_t iVar5;
  UList *list;
  UList *list_00;
  UEnumeration *en;
  UResourceBundle *resB;
  char *pcVar6;
  size_t sVar7;
  void *__dest;
  int32_t curIDLength;
  char prefRegion [4];
  UResourceBundle bundlekey;
  UResourceBundle to;
  UResourceBundle curbndl;
  UResourceBundle regbndl;
  int32_t local_360;
  char local_35c [4];
  char *local_358;
  UResourceBundle local_350;
  UResourceBundle local_288;
  UResourceBundle local_1c0;
  UResourceBundle local_f8;
  
  ulocimp_getRegionForSupplementalData_63(locale,'\x01',local_35c,4,status);
  list = ulist_createEmptyList_63(status);
  list_00 = ulist_createEmptyList_63(status);
  en = (UEnumeration *)uprv_malloc_63(0x38);
  if ((en == (UEnumeration *)0x0) || (U_ZERO_ERROR < *status)) {
    if (en == (UEnumeration *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      uprv_free_63(en);
    }
    ulist_deleteList_63(list);
    ulist_deleteList_63(list_00);
    en = (UEnumeration *)0x0;
  }
  else {
    en->baseContext = (void *)0x0;
    en->context = (void *)0x0;
    en->reset = ulist_reset_keyword_values_iterator_63;
    en->uNext = uenum_unextDefault_63;
    en->next = ulist_next_keyword_value_63;
    en->close = ulist_close_keyword_values_iterator_63;
    en->count = ulist_count_keyword_values_63;
    en->context = list;
    local_358 = key;
    resB = ures_openDirect_63("icudt63l-curr","supplementalData",status);
    ures_getByKey_63(resB,"CurrencyMap",resB,status);
    ures_initStackObject_63(&local_350);
    ures_initStackObject_63(&local_f8);
    ures_initStackObject_63(&local_1c0);
    ures_initStackObject_63(&local_288);
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      do {
        UVar2 = ures_hasNext_63(resB);
        if ((UVar2 == '\0') ||
           (ures_getNextResource_63(resB,&local_350,status), U_ZERO_ERROR < *status)) break;
        pcVar6 = ures_getKey_63(&local_350);
        iVar3 = strcmp(pcVar6,local_35c);
        if (commonlyUsed == '\0' || iVar3 == 0) {
          ures_getByKey_63(resB,pcVar6,&local_f8,status);
          if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
LAB_002ce516:
            do {
              if ((U_ZERO_ERROR < *status) || (UVar2 = ures_hasNext_63(&local_f8), UVar2 == '\0'))
              goto LAB_002ce4ee;
              ures_getNextResource_63(&local_f8,&local_1c0,status);
              UVar4 = ures_getType_63(&local_1c0);
            } while (UVar4 != RES_TABLE);
            pcVar6 = (char *)uprv_malloc_63(0x60);
            local_360 = 0x60;
            if (pcVar6 == (char *)0x0) {
              *status = U_MEMORY_ALLOCATION_ERROR;
              goto LAB_002ce4ee;
            }
            ures_getUTF8StringByKey_63(&local_1c0,"id",pcVar6,&local_360,'\x01',status);
            if (U_ZERO_ERROR < *status) goto LAB_002ce4ee;
            ures_getByKey_63(&local_1c0,"to",&local_288,status);
            UVar1 = *status;
            if (U_ZERO_ERROR < UVar1) {
              *status = U_ZERO_ERROR;
            }
            if (iVar3 == 0 && U_ZERO_ERROR < UVar1) {
              sVar7 = strlen(pcVar6);
              UVar2 = ulist_containsString_63(list,pcVar6,(int32_t)sVar7);
              if (UVar2 == '\0') {
                ulist_addItemEndList_63(list,pcVar6,'\x01',status);
                goto LAB_002ce516;
              }
            }
            sVar7 = strlen(pcVar6);
            UVar2 = ulist_containsString_63(list_00,pcVar6,(int32_t)sVar7);
            if (UVar2 == '\0' && commonlyUsed == '\0') {
              ulist_addItemEndList_63(list_00,pcVar6,'\x01',status);
            }
            else {
              uprv_free_63(pcVar6);
            }
            goto LAB_002ce516;
          }
          break;
        }
LAB_002ce4ee:
      } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if (commonlyUsed == '\0') {
        ulist_resetList_63(list_00);
        pcVar6 = (char *)ulist_getNext_63(list_00);
        while (pcVar6 != (char *)0x0) {
          sVar7 = strlen(pcVar6);
          UVar2 = ulist_containsString_63(list,pcVar6,(int32_t)sVar7);
          if (UVar2 == '\0') {
            __dest = uprv_malloc_63(0x60);
            sVar7 = strlen(pcVar6);
            memcpy(__dest,pcVar6,sVar7 + 1);
            ulist_addItemEndList_63(list,__dest,'\x01',status);
            if (U_ZERO_ERROR < *status) break;
          }
          pcVar6 = (char *)ulist_getNext_63(list_00);
        }
      }
      else {
        iVar5 = ulist_getListSize_63(list);
        if (iVar5 == 0) {
          uenum_close_63(en);
          en = ucurr_getKeywordValuesForLocale_63(local_358,"und",'\x01',status);
        }
      }
      ulist_resetList_63((UList *)en->context);
    }
    else {
      ulist_deleteList_63(list);
      uprv_free_63(en);
      en = (UEnumeration *)0x0;
    }
    ures_close_63(&local_288);
    ures_close_63(&local_1c0);
    ures_close_63(&local_f8);
    ures_close_63(&local_350);
    ures_close_63(resB);
    ulist_deleteList_63(list_00);
  }
  return en;
}

Assistant:

U_CAPI UEnumeration *U_EXPORT2 ucurr_getKeywordValuesForLocale(const char *key, const char *locale, UBool commonlyUsed, UErrorCode* status) {
    // Resolve region
    char prefRegion[ULOC_COUNTRY_CAPACITY];
    ulocimp_getRegionForSupplementalData(locale, TRUE, prefRegion, sizeof(prefRegion), status);
    
    // Read value from supplementalData
    UList *values = ulist_createEmptyList(status);
    UList *otherValues = ulist_createEmptyList(status);
    UEnumeration *en = (UEnumeration *)uprv_malloc(sizeof(UEnumeration));
    if (U_FAILURE(*status) || en == NULL) {
        if (en == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
        } else {
            uprv_free(en);
        }
        ulist_deleteList(values);
        ulist_deleteList(otherValues);
        return NULL;
    }
    memcpy(en, &defaultKeywordValues, sizeof(UEnumeration));
    en->context = values;
    
    UResourceBundle *bundle = ures_openDirect(U_ICUDATA_CURR, "supplementalData", status);
    ures_getByKey(bundle, "CurrencyMap", bundle, status);
    UResourceBundle bundlekey, regbndl, curbndl, to;
    ures_initStackObject(&bundlekey);
    ures_initStackObject(&regbndl);
    ures_initStackObject(&curbndl);
    ures_initStackObject(&to);
    
    while (U_SUCCESS(*status) && ures_hasNext(bundle)) {
        ures_getNextResource(bundle, &bundlekey, status);
        if (U_FAILURE(*status)) {
            break;
        }
        const char *region = ures_getKey(&bundlekey);
        UBool isPrefRegion = uprv_strcmp(region, prefRegion) == 0 ? TRUE : FALSE;
        if (!isPrefRegion && commonlyUsed) {
            // With commonlyUsed=true, we do not put
            // currencies for other regions in the
            // result list.
            continue;
        }
        ures_getByKey(bundle, region, &regbndl, status);
        if (U_FAILURE(*status)) {
            break;
        }
        while (U_SUCCESS(*status) && ures_hasNext(&regbndl)) {
            ures_getNextResource(&regbndl, &curbndl, status);
            if (ures_getType(&curbndl) != URES_TABLE) {
                // Currently, an empty ARRAY is mixed in.
                continue;
            }
            char *curID = (char *)uprv_malloc(sizeof(char) * ULOC_KEYWORDS_CAPACITY);
            int32_t curIDLength = ULOC_KEYWORDS_CAPACITY;
            if (curID == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                break;
            }

#if U_CHARSET_FAMILY==U_ASCII_FAMILY
            ures_getUTF8StringByKey(&curbndl, "id", curID, &curIDLength, TRUE, status);
            /* optimize - use the utf-8 string */
#else
            {
                       const UChar* defString = ures_getStringByKey(&curbndl, "id", &curIDLength, status);
                       if(U_SUCCESS(*status)) {
			   if(curIDLength+1 > ULOC_KEYWORDS_CAPACITY) {
				*status = U_BUFFER_OVERFLOW_ERROR;
			   } else {
                           	u_UCharsToChars(defString, curID, curIDLength+1);
			   }
                       }
            }
#endif	

            if (U_FAILURE(*status)) {
                break;
            }
            UBool hasTo = FALSE;
            ures_getByKey(&curbndl, "to", &to, status);
            if (U_FAILURE(*status)) {
                // Do nothing here...
                *status = U_ZERO_ERROR;
            } else {
                hasTo = TRUE;
            }
            if (isPrefRegion && !hasTo && !ulist_containsString(values, curID, (int32_t)uprv_strlen(curID))) {
                // Currently active currency for the target country
                ulist_addItemEndList(values, curID, TRUE, status);
            } else if (!ulist_containsString(otherValues, curID, (int32_t)uprv_strlen(curID)) && !commonlyUsed) {
                ulist_addItemEndList(otherValues, curID, TRUE, status);
            } else {
                uprv_free(curID);
            }
        }
        
    }
    if (U_SUCCESS(*status)) {
        if (commonlyUsed) {
            if (ulist_getListSize(values) == 0) {
                // This could happen if no valid region is supplied in the input
                // locale. In this case, we use the CLDR's default.
                uenum_close(en);
                en = ucurr_getKeywordValuesForLocale(key, "und", TRUE, status);
            }
        } else {
            // Consolidate the list
            char *value = NULL;
            ulist_resetList(otherValues);
            while ((value = (char *)ulist_getNext(otherValues)) != NULL) {
                if (!ulist_containsString(values, value, (int32_t)uprv_strlen(value))) {
                    char *tmpValue = (char *)uprv_malloc(sizeof(char) * ULOC_KEYWORDS_CAPACITY);
                    uprv_memcpy(tmpValue, value, uprv_strlen(value) + 1);
                    ulist_addItemEndList(values, tmpValue, TRUE, status);
                    if (U_FAILURE(*status)) {
                        break;
                    }
                }
            }
        }
        
        ulist_resetList((UList *)(en->context));
    } else {
        ulist_deleteList(values);
        uprv_free(en);
        values = NULL;
        en = NULL;
    }
    ures_close(&to);
    ures_close(&curbndl);
    ures_close(&regbndl);
    ures_close(&bundlekey);
    ures_close(bundle);
    
    ulist_deleteList(otherValues);
    
    return en;
}